

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxeffectslot.cpp
# Opt level: O3

void alGenAuxiliaryEffectSlots(ALsizei n,ALuint *effectslots)

{
  uint uVar1;
  iterator __position;
  pointer ptr;
  pointer pEVar2;
  ALeffectslot *pAVar3;
  EffectSlotSubList *pEVar4;
  char *pcVar5;
  ulong uVar6;
  ulong __n;
  ulong uVar7;
  ContextRef context;
  vector<ALuint> ids;
  unique_lock<std::mutex> slotlock;
  ALCcontext *local_70;
  vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> local_68;
  ALuint *local_48;
  unique_lock<std::mutex> local_40;
  
  GetContextRef();
  if (local_70 != (ALCcontext *)0x0) {
    if (n < 0) {
      ALCcontext::setError(local_70,0xa003,"Generating %d effect slots",(ulong)(uint)n);
    }
    else if (n != 0) {
      local_40._M_device = &local_70->mEffectSlotLock;
      local_40._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_40);
      local_40._M_owns = true;
      uVar1 = ((local_70->mDevice).mPtr)->AuxiliaryEffectSlotMax;
      if (uVar1 - local_70->mNumEffectSlots < (uint)n) {
        ALCcontext::setError
                  (local_70,0xa005,"Exceeding %u effect slot limit (%u + %d)",(ulong)uVar1,
                   (ulong)local_70->mNumEffectSlots,(ulong)(uint)n);
      }
      else {
        __n = (ulong)(uint)n;
        uVar7 = 0;
        for (pEVar2 = (local_70->mEffectSlotList).
                      super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pEVar2 != (local_70->mEffectSlotList).
                      super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>.
                      _M_impl.super__Vector_impl_data._M_finish; pEVar2 = pEVar2 + 1) {
          uVar6 = pEVar2->FreeMask - (pEVar2->FreeMask >> 1 & 0x5555555555555555);
          uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
          uVar7 = uVar7 + (((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
        }
        local_48 = effectslots;
        if (uVar7 < __n) {
          do {
            __position._M_current =
                 (local_70->mEffectSlotList).
                 super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (0x1ffffff0 <
                (ulong)((long)__position._M_current -
                       (long)(local_70->mEffectSlotList).
                             super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>
                             ._M_impl.super__Vector_impl_data._M_start)) {
LAB_001160a8:
              pcVar5 = "s";
              if (n == 1) {
                pcVar5 = "";
              }
              ALCcontext::setError
                        (local_70,0xa005,"Failed to allocate %d effectslot%s",(ulong)(uint)n,pcVar5)
              ;
              goto LAB_00116056;
            }
            if (__position._M_current ==
                (local_70->mEffectSlotList).
                super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>::
              _M_realloc_insert<>(&local_70->mEffectSlotList,__position);
              pEVar4 = (local_70->mEffectSlotList).
                       super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              (__position._M_current)->FreeMask = 0xffffffffffffffff;
              (__position._M_current)->EffectSlots = (ALeffectslot *)0x0;
              pEVar4 = __position._M_current + 1;
              (local_70->mEffectSlotList).
              super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>._M_impl.
              super__Vector_impl_data._M_finish = pEVar4;
            }
            pEVar4[-1].FreeMask = 0xffffffffffffffff;
            pAVar3 = (ALeffectslot *)al_calloc(8,0x7a00);
            pEVar4[-1].EffectSlots = pAVar3;
            if (pAVar3 == (ALeffectslot *)0x0) {
              pEVar4 = (local_70->mEffectSlotList).
                       super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1;
              (local_70->mEffectSlotList).
              super__Vector_base<EffectSlotSubList,_al::allocator<EffectSlotSubList,_8UL>_>._M_impl.
              super__Vector_impl_data._M_finish = pEVar4;
              EffectSlotSubList::~EffectSlotSubList(pEVar4);
              goto LAB_001160a8;
            }
            uVar7 = uVar7 + 0x40;
          } while (uVar7 < __n);
        }
        if (n == 1) {
          pAVar3 = anon_unknown.dwarf_8f03::AllocEffectSlot(local_70);
          if (pAVar3 != (ALeffectslot *)0x0) {
            *local_48 = pAVar3->id;
          }
        }
        else {
          local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
          super__Vector_impl_data._M_finish = (uint *)0x0;
          local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
          std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::reserve(&local_68,__n);
          do {
            pAVar3 = anon_unknown.dwarf_8f03::AllocEffectSlot(local_70);
            if (pAVar3 == (ALeffectslot *)0x0) {
              std::unique_lock<std::mutex>::unlock(&local_40);
              alGenAuxiliaryEffectSlots_cold_1();
              goto LAB_00116056;
            }
            if (local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,al::allocator<unsigned_int,4ul>>::
              _M_realloc_insert<unsigned_int&>
                        ((vector<unsigned_int,al::allocator<unsigned_int,4ul>> *)&local_68,
                         (iterator)
                         local_68.
                         super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl
                         .super__Vector_impl_data._M_finish,&pAVar3->id);
            }
            else {
              *local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
               super__Vector_impl_data._M_finish = pAVar3->id;
              local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            ptr = local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                  _M_impl.super__Vector_impl_data._M_start;
            n = n + -1;
          } while (n != 0);
          if ((long)local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_68.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                    _M_impl.super__Vector_impl_data._M_start != 0) {
            memmove(local_48,local_68.
                             super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_68.
                          super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                          _M_impl.super__Vector_impl_data._M_start);
          }
          if (ptr != (pointer)0x0) {
            al_free(ptr);
          }
        }
      }
LAB_00116056:
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
    }
    if (local_70 != (ALCcontext *)0x0) {
      al::intrusive_ref<ALCcontext>::release(&local_70->super_intrusive_ref<ALCcontext>);
    }
  }
  return;
}

Assistant:

AL_API void AL_APIENTRY alGenAuxiliaryEffectSlots(ALsizei n, ALuint *effectslots)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    if UNLIKELY(n < 0)
        context->setError(AL_INVALID_VALUE, "Generating %d effect slots", n);
    if UNLIKELY(n <= 0) return;

    std::unique_lock<std::mutex> slotlock{context->mEffectSlotLock};
    ALCdevice *device{context->mDevice.get()};
    if(static_cast<ALuint>(n) > device->AuxiliaryEffectSlotMax-context->mNumEffectSlots)
    {
        context->setError(AL_OUT_OF_MEMORY, "Exceeding %u effect slot limit (%u + %d)",
            device->AuxiliaryEffectSlotMax, context->mNumEffectSlots, n);
        return;
    }
    if(!EnsureEffectSlots(context.get(), static_cast<ALuint>(n)))
    {
        context->setError(AL_OUT_OF_MEMORY, "Failed to allocate %d effectslot%s", n,
            (n==1) ? "" : "s");
        return;
    }

    if(n == 1)
    {
        ALeffectslot *slot{AllocEffectSlot(context.get())};
        if(!slot) return;
        effectslots[0] = slot->id;
    }
    else
    {
        al::vector<ALuint> ids;
        ALsizei count{n};
        ids.reserve(static_cast<ALuint>(count));
        do {
            ALeffectslot *slot{AllocEffectSlot(context.get())};
            if(!slot)
            {
                slotlock.unlock();
                alDeleteAuxiliaryEffectSlots(static_cast<ALsizei>(ids.size()), ids.data());
                return;
            }
            ids.emplace_back(slot->id);
        } while(--count);
        std::copy(ids.cbegin(), ids.cend(), effectslots);
    }
}